

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

void __thiscall
CoreML::Specification::LinearQuantizationParams::_internal_add_bias
          (LinearQuantizationParams *this,float value)

{
  RepeatedField<float> *this_00;
  uint uVar1;
  uint uVar2;
  float *pfVar3;
  float tmp;
  
  this_00 = &this->bias_;
  uVar1 = (this->bias_).current_size_;
  uVar2 = (this->bias_).total_size_;
  if (uVar1 == uVar2) {
    google::protobuf::RepeatedField<float>::Reserve(this_00,uVar2 + 1);
  }
  pfVar3 = google::protobuf::RepeatedField<float>::elements(this_00);
  pfVar3[uVar1] = value;
  this_00->current_size_ = uVar1 + 1;
  return;
}

Assistant:

inline void LinearQuantizationParams::_internal_add_bias(float value) {
  bias_.Add(value);
}